

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTerminal.c
# Opt level: O0

int testTerminal(int argc,char **argv)

{
  undefined8 in_R8;
  undefined8 in_R9;
  char **argv_local;
  int argc_local;
  
  cmsysTerminal_cfprintf(0x454,(FILE *)_stdout,"Hello %s!","World",in_R8,in_R9,argv);
  fprintf(_stdout,"\n");
  return 0;
}

Assistant:

int testTerminal(int argc, char* argv[])
{
  (void)argc;
  (void)argv;
  kwsysTerminal_cfprintf(kwsysTerminal_Color_ForegroundYellow |
                           kwsysTerminal_Color_BackgroundBlue |
                           kwsysTerminal_Color_AssumeTTY,
                         stdout, "Hello %s!", "World");
  fprintf(stdout, "\n");
  return 0;
}